

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc2.c
# Opt level: O3

void OP_gcscan1(void)

{
  uint uVar1;
  
  if ((MachineState.tosvalue & 0xfff0000) == 0xe0000) {
    uVar1 = gcscan1(MachineState.tosvalue & 0xffff);
    MachineState.tosvalue = 0;
    if (uVar1 != 0xffffffff) {
      MachineState.tosvalue = uVar1 | 0xe0000;
    }
  }
  else {
    puts("OP_gcscan1: not a number");
  }
  MachineState.currentpc = MachineState.currentpc + 1;
  return;
}

Assistant:

void OP_gcscan1(void) {
  int scan;
#ifdef TRACE
  printPC();
  printf("TRACE: OP_gcscan1()\n");
#endif
  if ((TopOfStack & SEGMASK) == S_POSITIVE) {
    scan = gcscan1(LOLOC(TopOfStack));
    TopOfStack = (scan == -1) ? NIL : scan | S_POSITIVE;
  } else {
    printf("OP_gcscan1: not a number\n");
  }
  PC++;
}